

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_texshader.cpp
# Opt level: O3

bool __thiscall
FTextureShader::ParseShader(FTextureShader *this,FScanner *sc,TArray<FTextureID,_FTextureID> *names)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  FShaderLayer *this_00;
  bool bVar4;
  
  bVar2 = FScanner::GetString(sc);
  bVar4 = true;
  if (bVar2) {
    iVar3 = FName::NameManager::FindName(&FName::NameData,sc->String,false);
    (this->name).Index = iVar3;
    FScanner::MustGetStringName(sc,"{");
    bVar2 = FScanner::CheckString(sc,"}");
    if (!bVar2) {
      bVar4 = true;
      do {
        if (sc->End == true) {
          FScanner::ScriptError(sc,"Unexpected end of file encountered");
          return false;
        }
        bVar2 = FScanner::Compare(sc,"layer");
        if (bVar2) {
          this_00 = (FShaderLayer *)operator_new(0x188);
          FShaderLayer::FShaderLayer(this_00);
          bVar2 = FShaderLayer::ParseLayer(this_00,sc);
          if (bVar2) {
            if ((this->layers).super_TArray<FShaderLayer_*,_FShaderLayer_*>.Count < 8) {
              TArray<FShaderLayer_*,_FShaderLayer_*>::Grow
                        (&(this->layers).super_TArray<FShaderLayer_*,_FShaderLayer_*>,1);
              uVar1 = (this->layers).super_TArray<FShaderLayer_*,_FShaderLayer_*>.Count;
              (this->layers).super_TArray<FShaderLayer_*,_FShaderLayer_*>.Array[uVar1] = this_00;
              (this->layers).super_TArray<FShaderLayer_*,_FShaderLayer_*>.Count = uVar1 + 1;
            }
            else {
              FShaderLayer::~FShaderLayer(this_00);
              operator_delete(this_00,0x188);
              FScanner::ScriptMessage(sc,"Only 8 layers per texture allowed.");
            }
          }
          else {
            FShaderLayer::~FShaderLayer(this_00);
            operator_delete(this_00,0x188);
            bVar4 = false;
          }
        }
        else {
          FScanner::ScriptError(sc,"Unknown keyword \'%s\' in shader",sc->String);
        }
        bVar2 = FScanner::CheckString(sc,"}");
      } while (!bVar2);
    }
  }
  return bVar4;
}

Assistant:

bool FTextureShader::ParseShader(FScanner &sc, TArray<FTextureID> &names)
{
	bool retval = true;

	if (sc.GetString())
	{
		name = sc.String;

		sc.MustGetStringName("{");
		while (!sc.CheckString("}"))
		{
			if (sc.End)
			{
				sc.ScriptError("Unexpected end of file encountered");
				return false;
			}
			else if (sc.Compare("layer"))
			{
				FShaderLayer *lay = new FShaderLayer;
				if (lay->ParseLayer(sc))
				{
					if (layers.Size() < 8)
					{
						layers.Push(lay);
					}
					else
					{
						delete lay;
						sc.ScriptMessage("Only 8 layers per texture allowed.");
					}
				}
				else
				{
					delete lay;
					retval = false;
				}
			}
			else
			{
				sc.ScriptError("Unknown keyword '%s' in shader", sc.String);
			}
		}
	}
	return retval;
}